

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O1

bool tcu::anon_unknown_3::compareColors
               (RGBA *colorA,RGBA *colorB,int redBits,int greenBits,int blueBits)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  
  uVar1 = colorA->m_value;
  uVar2 = colorB->m_value;
  iVar3 = (uVar1 & 0xff) - (uVar2 & 0xff);
  iVar4 = -iVar3;
  if (0 < iVar3) {
    iVar4 = iVar3;
  }
  if (iVar4 <= 1 << (8U - (char)redBits & 0x1f)) {
    iVar3 = (uVar1 >> 8 & 0xff) - (uVar2 >> 8 & 0xff);
    iVar4 = -iVar3;
    if (0 < iVar3) {
      iVar4 = iVar3;
    }
    if (iVar4 <= 1 << (8U - (char)greenBits & 0x1f)) {
      iVar3 = (uVar1 >> 0x10 & 0xff) - (uVar2 >> 0x10 & 0xff);
      iVar4 = -iVar3;
      if (0 < iVar3) {
        iVar4 = iVar3;
      }
      return iVar4 <= 1 << (8U - (char)blueBits & 0x1f);
    }
  }
  return false;
}

Assistant:

bool compareColors (const tcu::RGBA& colorA, const tcu::RGBA& colorB, int redBits, int greenBits, int blueBits)
{
	const int thresholdRed		= 1 << (8 - redBits);
	const int thresholdGreen	= 1 << (8 - greenBits);
	const int thresholdBlue		= 1 << (8 - blueBits);

	return	deAbs32(colorA.getRed()   - colorB.getRed())   <= thresholdRed   &&
			deAbs32(colorA.getGreen() - colorB.getGreen()) <= thresholdGreen &&
			deAbs32(colorA.getBlue()  - colorB.getBlue())  <= thresholdBlue;
}